

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O3

int32 hmm_dump_vit_eval(hmm_t *hmm,FILE *fp)

{
  int32 iVar1;
  
  if (fp != (FILE *)0x0) {
    fwrite("BEFORE:\n",8,1,(FILE *)fp);
    hmm_dump(hmm,fp);
    iVar1 = hmm_vit_eval(hmm);
    fwrite("AFTER:\n",7,1,(FILE *)fp);
    hmm_dump(hmm,fp);
    return iVar1;
  }
  iVar1 = hmm_vit_eval(hmm);
  return iVar1;
}

Assistant:

int32
hmm_dump_vit_eval(hmm_t * hmm, FILE * fp)
{
    int32 bs = 0;

    if (fp) {
        fprintf(fp, "BEFORE:\n");
        hmm_dump(hmm, fp);
    }
    bs = hmm_vit_eval(hmm);
    if (fp) {
        fprintf(fp, "AFTER:\n");
        hmm_dump(hmm, fp);
    }

    return bs;
}